

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

string * translateOperatorNames(string *__return_storage_ptr__,string *s,int characteristic)

{
  bool bVar1;
  runtime_error *this;
  int i;
  ulong uVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_48b;
  allocator local_48a;
  allocator local_489;
  allocator local_488;
  allocator local_487;
  allocator_type local_486;
  allocator local_485;
  int local_484;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_480;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_478;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_470;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_468;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_460;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *local_458;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ereps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  estrs;
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  mreps;
  regex e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mstrs;
  regex e6;
  regex e5;
  regex e4;
  regex e3;
  regex e2;
  regex m12;
  regex m11;
  regex m10;
  regex m9;
  regex m8;
  regex m7;
  regex m6;
  regex m5;
  regex m4;
  regex m3;
  regex m2;
  regex m1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_190;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_170;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_150;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_130;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_110;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_f0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_d0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_b0;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m1,"(\\bMAX )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m2,"(\\bmax )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m3,"(\\bMAX\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m4,"(\\bmax\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m5,"(\\bMIN )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m6,"(\\bmin )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m7,"(\\bMIN\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m8,"(\\bmin\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m9,"(\\bNOT )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m10,"(\\bnot )",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m11,"(\\bNOT\\()",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&m12,"(\\bnot\\()",0x10);
  local_484 = characteristic;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1b0,&m1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_190,&m2);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_170,&m3);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_150,&m4);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_130,&m5);
  local_458 = &local_110;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_458,&m6);
  local_460 = &local_f0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_460,&m7);
  local_468 = &local_d0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_468,&m8);
  local_470 = &local_b0;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_470,&m9);
  local_478 = &local_90;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_478,&m10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_70,&m11);
  local_480 = &local_50;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(local_480,&m12);
  __l._M_len = 0xc;
  __l._M_array = (iterator)&local_1b0;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector(&mreps,__l,(allocator_type *)&e1);
  lVar3 = 0x160;
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&local_1b0._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string((string *)&local_1b0,">",(allocator *)&e1);
  std::__cxx11::string::string((string *)&local_190,">",(allocator *)&e2);
  std::__cxx11::string::string((string *)&local_170,">(",(allocator *)&e3);
  std::__cxx11::string::string((string *)&local_150,">(",(allocator *)&e4);
  std::__cxx11::string::string((string *)&local_130,"<",(allocator *)&e5);
  std::__cxx11::string::string((string *)&local_110,"<",(allocator *)&e6);
  std::__cxx11::string::string((string *)&local_f0,"<(",(allocator *)&ereps);
  std::__cxx11::string::string((string *)&local_d0,"<(",(allocator *)&estrs);
  std::__cxx11::string::string((string *)&local_b0,"~",&local_487);
  std::__cxx11::string::string((string *)&local_90,"~",&local_488);
  std::__cxx11::string::string((string *)&local_70,"~(",&local_489);
  std::__cxx11::string::string((string *)&local_50,"~(",&local_48a);
  __l_00._M_len = 0xc;
  __l_00._M_array = &local_1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&mstrs,__l_00,&local_48b);
  lVar3 = 0x160;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)mreps.
                            super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)mreps.
                            super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
              (&local_1b0,__return_storage_ptr__,
               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&(mreps.
                        super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar3),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((mstrs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    lVar3 = lVar3 + 0x20;
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e1,"(\\bAND) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e2,"(\\band) +",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e3,"(\\bOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e4,"(\\bor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e5,"(\\bXOR +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&e6,"(\\bxor +)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_1b0,&e1);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_190,&e2);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_170,&e3);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_150,&e4);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_130,&e5);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex(&local_110,&e6);
  __l_01._M_len = 6;
  __l_01._M_array = (iterator)&local_1b0;
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::vector(&ereps,__l_01,(allocator_type *)&estrs);
  lVar3 = 0xa0;
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               ((long)&local_1b0._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string((string *)&local_1b0,"*",&local_487);
  std::__cxx11::string::string((string *)&local_190,"*",&local_488);
  std::__cxx11::string::string((string *)&local_170,"|",&local_489);
  std::__cxx11::string::string((string *)&local_150,"|",&local_48a);
  std::__cxx11::string::string((string *)&local_130,"+",(allocator *)&local_48b);
  std::__cxx11::string::string((string *)&local_110,"+",&local_485);
  __l_02._M_len = 6;
  __l_02._M_array = &local_1b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&estrs,__l_02,&local_486);
  lVar3 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  if (local_484 == 2) {
    lVar3 = 0;
    for (uVar2 = 0;
        uVar2 < (ulong)((long)ereps.
                              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)ereps.
                              super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
                (&local_1b0,__return_storage_ptr__,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 ((long)&(ereps.
                          super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar3),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((estrs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),0)
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      lVar3 = lVar3 + 0x20;
    }
  }
  else {
    uVar2 = 0xffffffffffffffff;
    lVar3 = 0;
    while( true ) {
      uVar2 = uVar2 + 1;
      if ((ulong)((long)ereps.
                        super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)ereps.
                        super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar2) break;
      bVar1 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (__return_storage_ptr__,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                         ((long)&(ereps.
                                  super__Vector_base<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_flags + lVar3),0);
      lVar3 = lVar3 + 0x20;
      if (bVar1) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"characteristic 2 needed for AND/OR/XOR");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&estrs);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector(&ereps);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e6);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e5);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e4);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e3);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e2);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&mstrs);
  std::
  vector<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::allocator<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>_>_>
  ::~vector(&mreps);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m12);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m11);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m9);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m8);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m7);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m6);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m5);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m4);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m3);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m2);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&m1);
  return __return_storage_ptr__;
}

Assistant:

std::string translateOperatorNames(const std::string& s, int characteristic)
{
  // TODO (created 19 Jan 2021: this doesn't handle A or(A and B) (paren after or, and, xor).
  // fix this.  Can this code be simplified?
  // possibly change to a translate(string, word, replacement word) (perhaps no regex here?)

  // Oct 12, 2021: Not allowing AND/OR is characteristic != 2, but this isn't where it will fail.
  std::regex m1 ("(\\bMAX )");
  std::regex m2 ("(\\bmax )");
  std::regex m3 ("(\\bMAX\\()");
  std::regex m4 ("(\\bmax\\()");

  std::regex m5 ("(\\bMIN )");
  std::regex m6 ("(\\bmin )");
  std::regex m7 ("(\\bMIN\\()");
  std::regex m8 ("(\\bmin\\()");

  std::regex m9 ("(\\bNOT )");
  std::regex m10 ("(\\bnot )");
  std::regex m11 ("(\\bNOT\\()");
  std::regex m12 ("(\\bnot\\()");

  std::vector<std::regex> mreps =  { m1,  m2,   m3,   m4,  m5,  m6,   m7,   m8,  m9, m10,  m11,  m12};
  std::vector<std::string> mstrs = {">", ">", ">(", ">(", "<", "<", "<(", "<(", "~", "~", "~(", "~("};

  auto result = s;
  for (int i = 0; i < mreps.size(); ++i)
    {
      result = std::regex_replace(result, mreps[i], mstrs[i]);
    }
  
  std::regex e1 ("(\\bAND) +");
  std::regex e2 ("(\\band) +");
  std::regex e3 ("(\\bOR +)");
  std::regex e4 ("(\\bor +)");
  std::regex e5 ("(\\bXOR +)");
  std::regex e6 ("(\\bxor +)");

  std::vector<std::regex> ereps =  {  e1,  e2,  e3,  e4,  e5,  e6};
  std::vector<std::string> estrs = { "*", "*", "|", "|", "+", "+"};

  // if char=2 search and replace, if char!=2 search and error
  if (characteristic == 2)
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          result = std::regex_replace(result, ereps[i], estrs[i]);
        }
    }
  else
    {
      for (int i = 0; i < ereps.size(); ++i)
        {
          if(std::regex_search(result, ereps[i]))
            throw std::runtime_error("characteristic 2 needed for AND/OR/XOR");
        }
    }
  
  return result;
}